

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeptData.h
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
PeptData::SegmentsMass
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,PeptData *this,
          char *sequence,size_t sequence_length,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *cleavage_sites)

{
  iterator __position;
  pointer puVar1;
  mapped_type *pmVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  size_t sVar7;
  double segment;
  out_of_range e;
  double local_60;
  code *local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  size_t local_48;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (cleavage_sites->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
           .super__Vector_impl_data._M_start;
  lVar3 = (long)(cleavage_sites->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar3 != 0) {
    uVar4 = lVar3 >> 2;
    uVar5 = 0;
    local_58 = std::ios::widen;
    local_50 = cleavage_sites;
    local_48 = sequence_length;
    do {
      sVar7 = local_48;
      if (uVar4 - 1 != uVar5) {
        sVar7 = (size_t)puVar1[(int)uVar5 + 1];
      }
      uVar6 = puVar1[uVar5];
      local_60 = 0.0;
      for (; uVar6 < sVar7; uVar6 = uVar6 + 1) {
        pmVar2 = std::__detail::
                 _Map_base<char,_std::pair<const_char,_double>,_std::allocator<std::pair<const_char,_double>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<char,_std::pair<const_char,_double>,_std::allocator<std::pair<const_char,_double>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&this->mass_table_,sequence + uVar6);
        local_60 = *pmVar2 + local_60;
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                   &local_60);
      }
      else {
        *__position._M_current = local_60;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      puVar1 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = (long)(local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
    } while (uVar5 < uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> SegmentsMass(const char* sequence, size_t sequence_length,
                                     const std::vector<unsigned>& cleavage_sites) const {
        std::vector<double> segments_mass;
        for (unsigned i = 0; i < cleavage_sites.size(); ++i) {
            auto start = cleavage_sites[i];
            auto end = i == cleavage_sites.size() - 1
                       ? sequence_length
                       : cleavage_sites[i + 1];
            double segment = 0;
            try {
                for (auto j = start; j < end; ++j) {
                    segment += mass_table_.at(sequence[j]);  // will throw an exception if no such character in table
                }
            }
            catch (std::out_of_range e) {
                segment = 0;  // if there is an error, the segment equals to 0
            }
            segments_mass.push_back(segment);
        }
        return segments_mass;
    }